

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_thread.c
# Opt level: O2

void nni_plat_thr_set_name(nni_plat_thr *thr,char *name)

{
  pthread_t __target_thread;
  
  if (thr == (nni_plat_thr *)0x0) {
    __target_thread = pthread_self();
  }
  else {
    __target_thread = thr->tid;
  }
  pthread_setname_np(__target_thread,name);
  return;
}

Assistant:

void
nni_plat_thr_set_name(nni_plat_thr *thr, const char *name)
{
#if defined(NNG_HAVE_PTHREAD_SETNAME_NP)
#if defined(__APPLE__)
	// Darwin is weird, it can only set the name of pthread_self.
	if ((thr == NULL) || (pthread_self() == thr->tid)) {
		pthread_setname_np(name);
	}
#elif defined(__NetBSD__)
	if (thr == NULL) {
		pthread_setname_np(pthread_self(), "%s", name);
	} else {
		pthread_setname_np(thr->tid, "%s", name);
	}
#else
	if (thr == NULL) {
		pthread_setname_np(pthread_self(), name);
	} else {
		pthread_setname_np(thr->tid, name);
	}
#endif
#elif defined(NNG_HAVE_PTHREAD_SET_NAME_NP)
	if (thr == NULL) {
		pthread_set_name_np(pthread_self(), name);
	} else {
		pthread_set_name_np(thr->tid, name);
	}
#endif
}